

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

int __thiscall Buffer::Allocate(Buffer *this,string *FileName,int FileOff)

{
  list<int,_std::allocator<int>_> *this_00;
  _List_node_base *p_Var1;
  ostream *poVar2;
  const_iterator __position;
  int iVar3;
  Block *this_01;
  int pos;
  string local_50 [32];
  
  p_Var1 = (this->Empty_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var1 == (_List_node_base *)&this->Empty_Block) {
    this_00 = &this->Occupy_Block;
    __position._M_node = (_List_node_base *)this_00;
    do {
      __position._M_node = (__position._M_node)->_M_next;
      if (__position._M_node == (_List_node_base *)this_00) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Blocks are not enough!");
        std::endl<char,std::char_traits<char>>(poVar2);
        system("pause");
        exit(1);
      }
    } while (this->Pin[*(int *)&__position._M_node[1]._M_next] != 0);
    iVar3 = *(int *)&__position._M_node[1]._M_next;
    if (this->Dirty[iVar3] == 1) {
      Block::WriteFile(this->buffer + iVar3);
      iVar3 = *(int *)&__position._M_node[1]._M_next;
    }
    pos = iVar3;
    std::__cxx11::list<int,_std::allocator<int>_>::erase(this_00,__position);
  }
  else {
    iVar3 = *(int *)&p_Var1[1]._M_next;
    pos = iVar3;
    std::__cxx11::list<int,_std::allocator<int>_>::pop_front(&this->Empty_Block);
  }
  this_01 = this->buffer + iVar3;
  Block::BlockClear(this_01);
  std::__cxx11::string::string(local_50,(string *)FileName);
  std::__cxx11::string::_M_assign((string *)this_01);
  this_01->FileOff = FileOff;
  std::__cxx11::string::~string(local_50);
  Block::ReadFile(this_01);
  std::__cxx11::list<int,_std::allocator<int>_>::push_back(&this->Occupy_Block,&pos);
  this->Dirty[pos] = 0;
  this->Pin[pos] = 1;
  return pos;
}

Assistant:

int Buffer::Allocate(string FileName, int FileOff) {
	int pos;
	if (this->Empty_Block.empty()) {
		//û�пտ飬ֻ�ܸ���LRUԭ���滻
		list<int>::iterator it;
		for (it = this->Occupy_Block.begin(); it != this->Occupy_Block.end(); it++) {
			if (Pin[*it] == 0)	break;				//�ҵ���Զ�޸���û�������Ŀ�
		}
		if (it == this->Occupy_Block.end()) {
			cout << "Blocks are not enough!" << endl;
			system("pause");
			exit(1);
		}
		if (Dirty[*it] == 1) {
			this->buffer[*it].WriteFile();			//���޸ģ���д�ش���
		}
		pos = *it;
		it = this->Occupy_Block.erase(it);
	}
	else {
		//���пտ飬ȡ������
		pos = this->Empty_Block.front();
		this->Empty_Block.pop_front();
	}
	this->buffer[pos].BlockClear();					//��ոÿ�
	this->buffer[pos].BlockSet(FileName, FileOff);
	this->buffer[pos].ReadFile();
	this->Occupy_Block.push_back(pos);
	this->UnDirt(pos);
	this->Lock(pos);							//����������һ�θ��µ���֮ǰ���ñ��滻��ȥ
	return pos;
}